

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O2

char * __thiscall HttpResponse::getResponseString(HttpResponse *this)

{
  uint uVar1;
  int line;
  HttpResponse *this_00;
  char *pcVar2;
  ulong uVar3;
  
  uVar1 = this->mResponseCode;
  uVar3 = (ulong)uVar1;
  if (uVar1 == 0xffffffff) {
    pcVar2 = "called after destruction with mResponseCode (%d)";
    this_00 = (HttpResponse *)0x1;
    line = 0x68;
    uVar3 = 0xffffffffffffffff;
  }
  else {
    this_00 = this;
    if (0xfffffe0b < uVar1 - 600) goto LAB_0011a8bf;
    pcVar2 = "unexpected mResponseCode (%d)";
    line = 0x6c;
    this_00 = (HttpResponse *)0x0;
  }
  jh_log_print((int)this_00,"const char *HttpResponse::getResponseString() const",
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpResponse.cpp"
               ,line,pcVar2,uVar3);
LAB_0011a8bf:
  pcVar2 = getResponseString(this_00,this->mResponseCode);
  return pcVar2;
}

Assistant:

const char *HttpResponse::getResponseString() const
{
	if (mResponseCode == -1)
	{
		LOG_ERR_FATAL("called after destruction with mResponseCode (%d)",
					  mResponseCode);
	}
	else if (mResponseCode < 100 or mResponseCode > 599)
	{
		LOG_ERR("unexpected mResponseCode (%d)", mResponseCode);
	}

	return getResponseString( mResponseCode );
}